

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall FxPlusSign::FxPlusSign(FxPlusSign *this,FxExpression *operand)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_PlusSign,&operand->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxPlusSign_00705920;
  this->Operand = operand;
  return;
}

Assistant:

FxPlusSign::FxPlusSign(FxExpression *operand)
: FxExpression(EFX_PlusSign, operand->ScriptPosition)
{
	Operand=operand;
}